

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O0

void FAudio_OPERATIONSET_QueueSetEffectParameters
               (FAudioVoice *voice,uint32_t EffectIndex,void *pParameters,
               uint32_t ParametersByteSize,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  void *pvVar2;
  uint32_t in_ECX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  long *in_RDI;
  FAudio_OPERATIONSET_Operation *op;
  undefined4 in_stack_fffffffffffffff0;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x13514c);
  pFVar1 = QueueOperation((FAudioVoice *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                          (FAudio_OPERATIONSET_Type)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX);
  (pFVar1->Data).SetEffectParameters.EffectIndex = in_ESI;
  pvVar2 = (void *)(**(code **)(*in_RDI + 0xb8))(in_ECX);
  (pFVar1->Data).SetEffectParameters.pParameters = pvVar2;
  SDL_memcpy((pFVar1->Data).SetEffectParameters.pParameters,in_RDX,in_ECX);
  (pFVar1->Data).SetEffectParameters.ParametersByteSize = in_ECX;
  FAudio_PlatformUnlockMutex((FAudioMutex)0x1351c4);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueSetEffectParameters(
	FAudioVoice *voice,
	uint32_t EffectIndex,
	const void *pParameters,
	uint32_t ParametersByteSize,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_SETEFFECTPARAMETERS,
		OperationSet
	);

	op->Data.SetEffectParameters.EffectIndex = EffectIndex;
	op->Data.SetEffectParameters.pParameters = voice->audio->pMalloc(
		ParametersByteSize
	);
	FAudio_memcpy(
		op->Data.SetEffectParameters.pParameters,
		pParameters,
		ParametersByteSize
	);
	op->Data.SetEffectParameters.ParametersByteSize = ParametersByteSize;

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}